

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O0

void squall::detail::defun_global<void,std::shared_ptr<Foo>>
               (HSQUIRRELVM vm,HSQOBJECT *table,string *name,
               function<void_(std::shared_ptr<Foo>)> *f)

{
  function<void_(std::shared_ptr<Foo>)> *f_00;
  HSQUIRRELVM vm_00;
  HSQUIRRELVM v;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  HSQOBJECT in_stack_ffffffffffffff88;
  string local_58 [32];
  undefined8 local_38;
  SQObjectValue SStack_30;
  function<void_(std::shared_ptr<Foo>)> *local_28;
  function<void_(std::shared_ptr<Foo>)> *f_local;
  string *name_local;
  HSQOBJECT *table_local;
  HSQUIRRELVM vm_local;
  
  local_38 = *(undefined8 *)table;
  SStack_30 = table->_unVal;
  local_28 = f;
  f_local = (function<void_(std::shared_ptr<Foo>)> *)name;
  name_local = (string *)table;
  table_local = (HSQOBJECT *)vm;
  sq_pushobject(in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  f_00 = local_28;
  vm_00 = (HSQUIRRELVM)table_local;
  v = (HSQUIRRELVM)f_local;
  TypeMaskList<std::shared_ptr<Foo>>::doit_abi_cxx11_();
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14b3d3);
  defun<2,void,std::shared_ptr<Foo>>(vm_00,(string *)v,f_00,local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  sq_pop(v,(SQInteger)vm_00);
  return;
}

Assistant:

void defun_global(
    HSQUIRRELVM vm, const HSQOBJECT& table,
    const string& name, const std::function<R (T...)>& f) {

    sq_pushobject(vm, table);
    defun<2>(vm, name, f, _SC(".") + TypeMaskList<T...>::doit());
    sq_pop(vm, 1);
}